

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stopwatch.hpp
# Opt level: O0

time_t stopwatch::Stopwatch::ticks<(stopwatch::Stopwatch::TimeFormat)2>(TimePoint *st,TimePoint *en)

{
  rep rVar1;
  time_t up;
  time_t ns_count;
  type duration;
  TimePoint *en_local;
  TimePoint *st_local;
  
  duration.__r = (rep)en;
  ns_count = (time_t)std::chrono::operator-(en,st);
  up = (time_t)std::chrono::
               duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                         ((duration<long,_std::ratio<1L,_1000000000L>_> *)&ns_count);
  rVar1 = CLI::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)&up);
  return rVar1 / 1000000 + (long)(int)(uint)(4 < (rVar1 / 100000) % 10);
}

Assistant:

static std::time_t ticks(const TimePoint &st, const TimePoint &en){
    const auto duration = en - st;
    const time_t ns_count = std::chrono::duration_cast<std::chrono::nanoseconds>
        (duration).count();
    switch (fmt){
      case TimeFormat::NANOSECONDS:
        return ns_count;
      case TimeFormat::MICROSECONDS: {
        time_t up = ((ns_count/100)%10 >= 5) ? 1 : 0;
        return (ns_count / 1000) + up;
      }
      case TimeFormat::MILLISECONDS: {
        time_t up = ((ns_count/100000)%10 >= 5) ? 1 : 0;
        return (ns_count / 1000000) + up;
      }
      case TimeFormat::SECONDS: {
        time_t up = ((ns_count/100000000)%10 >= 5) ? 1 : 0;
        return (ns_count / 1000000000) + up;
      }
    }
  }